

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemCast(Mem *pMem,u8 aff,u8 encoding)

{
  int iVar1;
  sqlite3_value *pMem_00;
  char in_DL;
  byte in_SIL;
  long in_RDI;
  int rc;
  undefined6 in_stack_ffffffffffffffd8;
  u8 in_stack_ffffffffffffffde;
  u8 in_stack_ffffffffffffffdf;
  
  if ((*(ushort *)(in_RDI + 0x14) & 1) == 0) {
    pMem_00 = (sqlite3_value *)(ulong)(in_SIL - 0x41);
    switch(pMem_00) {
    case (sqlite3_value *)0x0:
      if ((*(ushort *)(in_RDI + 0x14) & 0x10) == 0) {
        sqlite3ValueApplyAffinity(pMem_00,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
        if ((*(ushort *)(in_RDI + 0x14) & 2) != 0) {
          *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0xf240 | 0x10;
        }
      }
      else {
        *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0xf250;
      }
      break;
    default:
      *(ushort *)(in_RDI + 0x14) =
           *(ushort *)(in_RDI + 0x14) | (ushort)((int)(*(ushort *)(in_RDI + 0x14) & 0x10) >> 3);
      sqlite3ValueApplyAffinity(pMem_00,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
      *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0xfbc3;
      if (in_DL != '\x01') {
        *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) & 0xfffffffe;
      }
      iVar1 = sqlite3VdbeChangeEncoding
                        ((Mem *)CONCAT17(in_stack_ffffffffffffffdf,
                                         CONCAT16(in_stack_ffffffffffffffde,
                                                  in_stack_ffffffffffffffd8)),0);
      if (iVar1 != 0) {
        return iVar1;
      }
      sqlite3VdbeMemZeroTerminateIfAble((Mem *)0x18456f);
      break;
    case (sqlite3_value *)0x2:
      sqlite3VdbeMemNumerify(pMem_00);
      break;
    case (sqlite3_value *)0x3:
      sqlite3VdbeMemIntegerify((Mem *)0x1844c8);
      break;
    case (sqlite3_value *)0x4:
      sqlite3VdbeMemRealify((Mem *)0x1844d7);
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCast(Mem *pMem, u8 aff, u8 encoding){
  if( pMem->flags & MEM_Null ) return SQLITE_OK;
  switch( aff ){
    case SQLITE_AFF_BLOB: {   /* Really a cast to BLOB */
      if( (pMem->flags & MEM_Blob)==0 ){
        sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
        assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
        if( pMem->flags & MEM_Str ) MemSetTypeFlag(pMem, MEM_Blob);
      }else{
        pMem->flags &= ~(MEM_TypeMask&~MEM_Blob);
      }
      break;
    }
    case SQLITE_AFF_NUMERIC: {
      sqlite3VdbeMemNumerify(pMem);
      break;
    }
    case SQLITE_AFF_INTEGER: {
      sqlite3VdbeMemIntegerify(pMem);
      break;
    }
    case SQLITE_AFF_REAL: {
      sqlite3VdbeMemRealify(pMem);
      break;
    }
    default: {
      int rc;
      assert( aff==SQLITE_AFF_TEXT );
      assert( MEM_Str==(MEM_Blob>>3) );
      pMem->flags |= (pMem->flags&MEM_Blob)>>3;
      sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
      assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
      pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal|MEM_Blob|MEM_Zero);
      if( encoding!=SQLITE_UTF8 ) pMem->n &= ~1;
      rc = sqlite3VdbeChangeEncoding(pMem, encoding);
      if( rc ) return rc;
      sqlite3VdbeMemZeroTerminateIfAble(pMem);
    }
  }
  return SQLITE_OK;
}